

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdeclnode.cpp
# Opt level: O1

void __thiscall
FuncDeclNode::check(FuncDeclNode *this,
                   vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                   *tables)

{
  string *name;
  pointer pmVar1;
  TypeNode *pTVar2;
  _Alloc_hider _Var3;
  ArgNode *pAVar4;
  __uniq_ptr_data<TypeNode,_std::default_delete<TypeNode>,_true,_true> _Var5;
  long lVar6;
  SequenceNode *pSVar7;
  bool bVar8;
  runtime_error *prVar9;
  long *plVar10;
  size_type *psVar11;
  vector<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>,std::allocator<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>>
  *this_00;
  pointer puVar12;
  string funcScope;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_208;
  vector<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>,std::allocator<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>>
  *local_188;
  SymbolInfo local_180;
  undefined1 *local_120;
  long local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  string local_100;
  string local_e0;
  string local_c0;
  pointer local_a0;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  name = &this->name;
  bVar8 = wasDeclared(tables,name);
  if (bVar8) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_180.kind,"error: multiple definition of function \'",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
    local_208.first._M_dataplus._M_p = (pointer)*plVar10;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_208.first._M_dataplus._M_p == psVar11) {
      local_208.first.field_2._M_allocated_capacity = *psVar11;
      local_208.first.field_2._8_8_ = plVar10[3];
      local_208.first._M_dataplus._M_p = (pointer)&local_208.first.field_2;
    }
    else {
      local_208.first.field_2._M_allocated_capacity = *psVar11;
    }
    local_208.first._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::runtime_error::runtime_error(prVar9,(string *)&local_208);
    *(undefined ***)prVar9 = &PTR__runtime_error_00139738;
    __cxa_throw(prVar9,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_120 = &local_110;
  local_118 = 0;
  local_110 = 0;
  if ((long)(tables->
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(tables->
            super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x30) {
    std::__cxx11::string::_M_replace((ulong)&local_120,0,(char *)0x0,0x12bad1);
    pmVar1 = (tables->
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_188 = (vector<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>,std::allocator<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>>
                 *)tables;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"func","");
    pTVar2 = (this->returnType)._M_t.super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>
             ._M_t.super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
             super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl;
    _Var3._M_p = (pTVar2->name)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,_Var3._M_p,_Var3._M_p + (pTVar2->name)._M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_120,local_120 + local_118);
    SymbolInfo::SymbolInfo(&local_180,&local_50,&local_70,&local_90);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
              (&local_208,name,&local_180);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                *)(pmVar1 + -1),&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.second.scope._M_dataplus._M_p != &local_208.second.scope.field_2) {
      operator_delete(local_208.second.scope._M_dataplus._M_p,
                      local_208.second.scope.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.second.type._M_dataplus._M_p != &local_208.second.type.field_2) {
      operator_delete(local_208.second.type._M_dataplus._M_p,
                      local_208.second.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.second.kind._M_dataplus._M_p != &local_208.second.kind.field_2) {
      operator_delete(local_208.second.kind._M_dataplus._M_p,
                      local_208.second.kind.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
      operator_delete(local_208.first._M_dataplus._M_p,
                      local_208.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.scope._M_dataplus._M_p != &local_180.scope.field_2) {
      operator_delete(local_180.scope._M_dataplus._M_p,
                      local_180.scope.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.type._M_dataplus._M_p != &local_180.type.field_2) {
      operator_delete(local_180.type._M_dataplus._M_p,
                      local_180.type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.kind._M_dataplus._M_p != &local_180.kind.field_2) {
      operator_delete(local_180.kind._M_dataplus._M_p,
                      local_180.kind.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_188;
    if (local_120 != &local_110) {
      operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
    }
    local_208.first.field_2._8_8_ = &local_208.first._M_string_length;
    local_208.first.field_2._M_allocated_capacity = 0;
    local_208.first._M_dataplus._M_p = (pointer)0x0;
    local_208.first._M_string_length = 0;
    local_208.second.kind._M_string_length = 0;
    local_208.second.kind._M_dataplus._M_p = (pointer)local_208.first.field_2._8_8_;
    std::
    vector<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>,std::allocator<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>>
    ::
    emplace_back<std::map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>>
              (this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
                        *)&local_208);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
                 *)&local_208);
    puVar12 = (this->args).
              super__Vector_base<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (this->args).
               super__Vector_base<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar12 != local_a0) {
      do {
        bVar8 = wasDeclared((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                             *)this_00,
                            &(((puVar12->_M_t).
                               super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
                               super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
                               super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl)->super_VarNode)
                             .name);
        if (bVar8) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_180.kind,"error: multiple definition of \'",
                         &(((puVar12->_M_t).
                            super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
                            super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
                            super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl)->super_VarNode).
                          name);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
          local_208.first._M_dataplus._M_p = (pointer)*plVar10;
          psVar11 = (size_type *)(plVar10 + 2);
          if ((size_type *)local_208.first._M_dataplus._M_p == psVar11) {
            local_208.first.field_2._M_allocated_capacity = *psVar11;
            local_208.first.field_2._8_8_ = plVar10[3];
            local_208.first._M_dataplus._M_p = (pointer)&local_208.first.field_2;
          }
          else {
            local_208.first.field_2._M_allocated_capacity = *psVar11;
          }
          local_208.first._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::runtime_error::runtime_error(prVar9,(string *)&local_208);
          *(undefined ***)prVar9 = &PTR__runtime_error_00139738;
          __cxa_throw(prVar9,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
        }
        pmVar1 = *(pointer *)(this_00 + 8);
        pAVar4 = (puVar12->_M_t).super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
                 super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
                 super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"var","");
        _Var5.super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>._M_t.
        super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
        super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl =
             (((puVar12->_M_t).super___uniq_ptr_impl<ArgNode,_std::default_delete<ArgNode>_>._M_t.
               super__Tuple_impl<0UL,_ArgNode_*,_std::default_delete<ArgNode>_>.
               super__Head_base<0UL,_ArgNode_*,_false>._M_head_impl)->type)._M_t.
             super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        lVar6 = *(long *)((long)_Var5.
                                super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>._M_t
                                .super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
                                super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl + 0x10);
        local_98 = puVar12;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,lVar6,
                   *(long *)((long)_Var5.
                                   super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>
                                   .super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl + 0x18) +
                   lVar6);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"local","");
        SymbolInfo::SymbolInfo(&local_180,&local_e0,&local_100,&local_c0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
                  (&local_208,&(pAVar4->super_VarNode).name,&local_180);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                    *)(pmVar1 + -1),&local_208);
        this_00 = local_188;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.second.scope._M_dataplus._M_p != &local_208.second.scope.field_2) {
          operator_delete(local_208.second.scope._M_dataplus._M_p,
                          local_208.second.scope.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.second.type._M_dataplus._M_p != &local_208.second.type.field_2) {
          operator_delete(local_208.second.type._M_dataplus._M_p,
                          local_208.second.type.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.second.kind._M_dataplus._M_p != &local_208.second.kind.field_2) {
          operator_delete(local_208.second.kind._M_dataplus._M_p,
                          local_208.second.kind.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
          operator_delete(local_208.first._M_dataplus._M_p,
                          local_208.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.scope._M_dataplus._M_p != &local_180.scope.field_2) {
          operator_delete(local_180.scope._M_dataplus._M_p,
                          local_180.scope.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.type._M_dataplus._M_p != &local_180.type.field_2) {
          operator_delete(local_180.type._M_dataplus._M_p,
                          local_180.type.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.kind._M_dataplus._M_p != &local_180.kind.field_2) {
          operator_delete(local_180.kind._M_dataplus._M_p,
                          local_180.kind.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        puVar12 = local_98 + 1;
      } while (puVar12 != local_a0);
    }
    pTVar2 = (this->returnType)._M_t.super___uniq_ptr_impl<TypeNode,_std::default_delete<TypeNode>_>
             ._M_t.super__Tuple_impl<0UL,_TypeNode_*,_std::default_delete<TypeNode>_>.
             super__Head_base<0UL,_TypeNode_*,_false>._M_head_impl;
    (**(code **)((long)(pTVar2->super_ASTNode)._vptr_ASTNode + 0x28))(pTVar2,this_00);
    pSVar7 = (this->body)._M_t.
             super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>._M_t.
             super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
             super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl;
    (**(code **)((long)(pSVar7->super_ASTNode)._vptr_ASTNode + 0x28))(pSVar7,this_00);
    pmVar1 = *(pointer *)(this_00 + 8);
    *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
      **)(this_00 + 8) = &pmVar1[-1]._M_t;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::~_Rb_tree(&pmVar1[-1]._M_t);
    return;
  }
  std::__cxx11::string::operator=((string *)&local_120,"local");
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_180.kind,"error: function \'",name);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_208.first._M_dataplus._M_p = (pointer)*plVar10;
  psVar11 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_208.first._M_dataplus._M_p == psVar11) {
    local_208.first.field_2._M_allocated_capacity = *psVar11;
    local_208.first.field_2._8_8_ = plVar10[3];
    local_208.first._M_dataplus._M_p = (pointer)&local_208.first.field_2;
  }
  else {
    local_208.first.field_2._M_allocated_capacity = *psVar11;
  }
  local_208.first._M_string_length = plVar10[1];
  *plVar10 = (long)psVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::runtime_error::runtime_error(prVar9,(string *)&local_208);
  *(undefined ***)prVar9 = &PTR__runtime_error_00139738;
  __cxa_throw(prVar9,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FuncDeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, name)) {
        throw SemanticException("error: multiple definition of function '" + name + "'");
    } else {
        auto funcScope = std::string();
        if (tables.size() == 1) {
            funcScope = "global";
        } else {
            funcScope = "local"; // this is an error
            // TODO: Need to handle methods
            throw SemanticException("error: function '" + name + "' can only be declared in the global scope");
        }
        tables.back().emplace(std::make_pair(name, SymbolInfo("func", returnType->name, funcScope)));
//        std::cout << "new func added to table: named " << name << ", ret type: "
//                  << returnType->name << ", scope: " << funcScope << "\n";
    }

    // make a new scope for the args

    tables.push_back(SymbolTable());

    for (const auto& a : args) {
        if (wasDeclared(tables, a->name)) {
            throw SemanticException("error: multiple definition of '" + a->name + "'");
        } else {
            tables.back().emplace(std::make_pair(a->name, SymbolInfo("var", a->type->name, "local")));
//            std::cout << "\tnew var (arg) added to table: named " << a->name << ", type: "
//                      << a->type->name << ", scope: " << "local" << "\n";
        }
    }

    returnType->check(tables);
    body->check(tables);

    tables.pop_back();
}